

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shufflenetv2.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __last;
  char *pcVar1;
  int *piVar2;
  _func_int **__first;
  char cVar3;
  int iVar4;
  Layer *pLVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  Mat local_1f8;
  vector<float,_std::allocator<float>_> cls_scores;
  ParamDict pd;
  Allocator *local_168;
  int local_160;
  int iStack_15c;
  int iStack_158;
  int iStack_154;
  Extractor ex;
  Mat local_128;
  Net shufflenetv2;
  float norm_vals [3];
  Mat m;
  int local_68;
  int local_64;
  uchar *local_60;
  
  if (argc == 2) {
    pcVar1 = argv[1];
    std::__cxx11::string::string((string *)&shufflenetv2,pcVar1,(allocator *)&local_128);
    cv::imread((string *)&m,(int)&shufflenetv2);
    if ((Allocator **)shufflenetv2._vptr_Net != &shufflenetv2.opt.blob_allocator) {
      operator_delete(shufflenetv2._vptr_Net);
    }
    cVar3 = cv::Mat::empty();
    if (cVar3 == '\0') {
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&shufflenetv2);
      shufflenetv2.opt.use_vulkan_compute = true;
      iVar4 = ncnn::Net::load_param(&shufflenetv2,"shufflenet_v2_x0.5.param");
      if ((iVar4 != 0) ||
         (iVar4 = ncnn::Net::load_model(&shufflenetv2,"shufflenet_v2_x0.5.bin"), iVar4 != 0)) {
        exit(-1);
      }
      ncnn::Mat::from_pixels_resize
                (&local_128,local_60,2,local_64,local_68,0xe0,0xe0,(Allocator *)0x0);
      norm_vals[0] = 0.003921569;
      norm_vals[1] = 0.003921569;
      norm_vals[2] = 0.003921569;
      ncnn::Mat::substract_mean_normalize(&local_128,(float *)0x0,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"data",&local_128);
      local_1f8.cstep = 0;
      local_1f8.data = (void *)0x0;
      local_1f8.refcount._0_4_ = 0;
      local_1f8.refcount._4_4_ = 0;
      local_1f8.elemsize._0_4_ = 0;
      local_1f8.elemsize._4_4_ = 0;
      local_1f8.elempack = 0;
      local_1f8.allocator = (Allocator *)0x0;
      local_1f8.dims = 0;
      local_1f8.w = 0;
      local_1f8.h = 0;
      local_1f8.d = 0;
      local_1f8.c = 0;
      ncnn::Extractor::extract(&ex,"fc",&local_1f8,0);
      pLVar5 = ncnn::create_layer("Softmax");
      ncnn::ParamDict::ParamDict(&pd);
      (*pLVar5->_vptr_Layer[2])(pLVar5,&pd);
      (*pLVar5->_vptr_Layer[9])(pLVar5,&local_1f8,&shufflenetv2.opt);
      (*pLVar5->_vptr_Layer[1])(pLVar5);
      ncnn::ParamDict::~ParamDict(&pd);
      ncnn::Mat::reshape((Mat *)&pd,&local_1f8,local_1f8.h * local_1f8.w * local_1f8.c,
                         (Allocator *)0x0);
      piVar2 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_1f8.allocator == (Allocator *)0x0) {
            if (local_1f8.data != (void *)0x0) {
              free(local_1f8.data);
            }
          }
          else {
            (*(local_1f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar2 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      local_1f8.data = pd._vptr_ParamDict;
      local_1f8.refcount._0_4_ = pd.d._0_4_;
      local_1f8.refcount._4_4_ = pd.d._4_4_;
      local_1f8.allocator = local_168;
      local_1f8.dims = local_160;
      local_1f8.w = iStack_15c;
      local_1f8.h = iStack_158;
      local_1f8.d = iStack_154;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_168 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_168->_vptr_Allocator[3])();
          }
        }
      }
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      std::vector<float,_std::allocator<float>_>::resize(&cls_scores,(long)local_1f8.w);
      if (0 < (long)local_1f8.w) {
        lVar7 = 0;
        do {
          cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar7] = *(float *)((long)local_1f8.data + lVar7 * 4);
          lVar7 = lVar7 + 1;
        } while (local_1f8.w != lVar7);
      }
      piVar2 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_1f8.allocator == (Allocator *)0x0) {
            if ((_func_int **)local_1f8.data != (_func_int **)0x0) {
              free(local_1f8.data);
            }
          }
          else {
            (*(local_1f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_1f8.cstep = 0;
      local_1f8.data = (void *)0x0;
      local_1f8.refcount._0_4_ = 0;
      local_1f8.refcount._4_4_ = 0;
      local_1f8.elemsize._0_4_ = 0;
      local_1f8.elemsize._4_4_ = 0;
      local_1f8.elempack = 0;
      local_1f8.dims = 0;
      local_1f8.w = 0;
      local_1f8.h = 0;
      local_1f8.d = 0;
      local_1f8.c = 0;
      ncnn::Extractor::~Extractor(&ex);
      if ((Allocator *)local_128.refcount != (Allocator *)0x0) {
        LOCK();
        *(int *)(_func_int ***)local_128.refcount = *(int *)(_func_int ***)local_128.refcount + -1;
        UNLOCK();
        if (*(int *)(_func_int ***)local_128.refcount == 0) {
          if (local_128.allocator == (Allocator *)0x0) {
            if ((Allocator *)local_128.data != (Allocator *)0x0) {
              free(local_128.data);
            }
          }
          else {
            (*(local_128.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&shufflenetv2);
      shufflenetv2._vptr_Net = (_func_int **)0x0;
      shufflenetv2.opt.lightmode = false;
      shufflenetv2.opt.use_shader_pack8 = false;
      shufflenetv2.opt.use_subgroup_ops = false;
      shufflenetv2.opt.use_reserved_0 = false;
      shufflenetv2.opt.num_threads = 0;
      shufflenetv2.opt.blob_allocator = (Allocator *)0x0;
      uVar8 = (uint)((ulong)((long)cls_scores.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)cls_scores.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::resize
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                 &shufflenetv2,(long)(int)uVar8);
      __first = shufflenetv2._vptr_Net;
      if (0 < (int)uVar8) {
        uVar6 = 0;
        do {
          *(float *)(shufflenetv2._vptr_Net + uVar6) =
               cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6];
          *(int *)((long)shufflenetv2._vptr_Net + uVar6 * 8 + 4) = (int)uVar6;
          uVar6 = uVar6 + 1;
        } while ((uVar8 & 0x7fffffff) != uVar6);
      }
      __last._M_current = (pair<float,_int> *)(shufflenetv2._vptr_Net + 3);
      std::
      __heap_select<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<float,int>>>>
                (shufflenetv2._vptr_Net,__last._M_current,shufflenetv2.opt._0_8_);
      std::
      __sort_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<float,int>>>>
                ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                  )__first,__last,
                 (_Iter_comp_iter<std::greater<std::pair<float,_int>_>_> *)&local_128);
      main_cold_2();
      iVar4 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar1);
      iVar4 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<float> cls_scores;
    detect_shufflenetv2(m, cls_scores);

    print_topk(cls_scores, 3);

    return 0;
}